

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<double,int>(BaseAppender *this,Vector *col,double input)

{
  bool bVar1;
  InvalidInputException *this_00;
  duckdb *this_01;
  int result;
  int32_t local_44;
  double local_40;
  string local_38;
  
  this_01 = (duckdb *)0x0;
  local_40 = input;
  bVar1 = TryCast::Operation<double,int>(input,&local_44,false);
  if (bVar1) {
    *(int32_t *)(col->data + (this->chunk).count * 4) = local_44;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<double,int>(&local_38,this_01,local_40);
  InvalidInputException::InvalidInputException(this_00,&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}